

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

bool __thiscall
gl4cts::GPUShaderFP64Test4::verifyProgramInterfaceQuerySupport(GPUShaderFP64Test4 *this)

{
  string *psVar1;
  ostringstream *poVar2;
  char **value;
  GLuint GVar3;
  _stage_data *p_Var4;
  GLint GVar5;
  GLint GVar6;
  bool bVar7;
  int iVar8;
  deUint32 dVar9;
  undefined4 uVar10;
  undefined4 extraout_var;
  char *pcVar11;
  MessageBuilder *pMVar12;
  TestError *this_00;
  long lVar13;
  long lVar14;
  long lVar15;
  _stage_data **pp_Var16;
  char **ppcVar17;
  _program_interface_query_test_item *value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  bool bVar18;
  bool bVar19;
  GLint max_uniform_name_length;
  long local_570;
  GLuint local_568;
  GLint retrieved_name_length;
  GLint n_written_items;
  allocator<char> local_55b;
  allocator<char> local_55a;
  allocator<char> local_559;
  allocator<char> local_558;
  allocator<char> local_557;
  allocator<char> local_556;
  allocator<char> local_555;
  allocator<char> local_554;
  allocator<char> local_553;
  allocator<char> local_552;
  allocator<char> local_551;
  GLint temp_buffer [2];
  undefined8 local_508;
  _stage_data *cs_stages [1];
  GLenum properties [2];
  _program_interface_query_test_item uniforms [16];
  undefined1 local_1d8 [8];
  ostream local_1d0;
  _stage_data *noncs_stages [5];
  
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_570 = CONCAT44(extraout_var,iVar8);
  cs_stages[0] = &this->m_data_cs;
  noncs_stages[0] = &this->m_data_fs;
  noncs_stages[1] = &this->m_data_gs;
  noncs_stages[2] = &this->m_data_tc;
  noncs_stages[3] = &this->m_data_te;
  noncs_stages[4] = &this->m_data_vs;
  local_508._0_4_ = this->m_po_cs_id;
  local_508._4_4_ = this->m_po_noncs_id;
  value = &this->m_uniform_name_buffer;
  bVar7 = true;
  lVar14 = 0;
  do {
    lVar13 = local_570;
    if (lVar14 == 2) {
      return bVar7;
    }
    local_568 = *(GLuint *)((long)cs_stages + lVar14 * 4 + -8);
    GVar3 = this->m_po_cs_id;
    pp_Var16 = noncs_stages;
    if (local_568 == GVar3) {
      pp_Var16 = cs_stages;
    }
    ppcVar17 = initProgramObjects::noncs_uniform_prefixes;
    if (local_568 == GVar3) {
      ppcVar17 = initProgramObjects::cs_uniform_prefixes;
    }
    if (local_568 != 0) {
      bVar19 = local_568 != GVar3;
      max_uniform_name_length = 0;
      (**(code **)(local_570 + 0x990))(local_568,0x92e1,0x92f6,&max_uniform_name_length);
      dVar9 = (**(code **)(lVar13 + 0x800))();
      glu::checkError(dVar9,"glGetProgramInterfaceiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                      ,0x1a93);
      pcVar11 = (char *)operator_new__((long)max_uniform_name_length);
      *value = pcVar11;
      for (lVar13 = 0; lVar13 != (ulong)bVar19 * 4 + 1; lVar13 = lVar13 + 1) {
        p_Var4 = pp_Var16[lVar13];
        pcVar11 = ppcVar17[lVar13];
        uniforms[0].expected_array_size = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&uniforms[0].name,"double",(allocator<char> *)local_1d8);
        uniforms[0].expected_type = 0x140a;
        uniforms[0].location = (p_Var4->uniforms).uniform_location_double;
        uniforms[1].expected_array_size = 2;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&uniforms[1].name,"double_arr[0]",(allocator<char> *)properties);
        uniforms[1].expected_type = 0x140a;
        uniforms[1].location = (p_Var4->uniforms).uniform_location_double_arr[0];
        uniforms[2].expected_array_size = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&uniforms[2].name,"dvec2",(allocator<char> *)temp_buffer);
        uniforms[2].expected_type = 0x8ffc;
        uniforms[2].location = (p_Var4->uniforms).uniform_location_dvec2;
        uniforms[3].expected_array_size = 2;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&uniforms[3].name,"dvec2_arr[0]",(allocator<char> *)&n_written_items);
        uniforms[3].expected_type = 0x8ffc;
        uniforms[3].location = (p_Var4->uniforms).uniform_location_dvec2_arr[0];
        uniforms[4].expected_array_size = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&uniforms[4].name,"dvec3",(allocator<char> *)&retrieved_name_length);
        uniforms[4].expected_type = 0x8ffd;
        uniforms[4].location = (p_Var4->uniforms).uniform_location_dvec3;
        uniforms[5].expected_array_size = 2;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&uniforms[5].name,"dvec3_arr[0]",&local_551);
        uniforms[5].expected_type = 0x8ffd;
        uniforms[5].location = (p_Var4->uniforms).uniform_location_dvec3_arr[0];
        uniforms[6].expected_array_size = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&uniforms[6].name,"dvec4",&local_552);
        uniforms[6].expected_type = 0x8ffe;
        uniforms[6].location = (p_Var4->uniforms).uniform_location_dvec4;
        uniforms[7].expected_array_size = 2;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&uniforms[7].name,"dvec4_arr[0]",&local_553);
        uniforms[7].expected_type = 0x8ffe;
        uniforms[7].location = (p_Var4->uniforms).uniform_location_dvec4_arr[0];
        uniforms[8].expected_array_size = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&uniforms[8].name,"array[0].struct_double",&local_554);
        uniforms[8].expected_type = 0x140a;
        uniforms[8].location = p_Var4->uniform_structure_arrays[0].uniform_location_double;
        uniforms[9].expected_array_size = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&uniforms[9].name,"array[0].struct_dvec2",&local_555);
        uniforms[9].expected_type = 0x8ffc;
        uniforms[9].location = p_Var4->uniform_structure_arrays[0].uniform_location_dvec2;
        uniforms[10].expected_array_size = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&uniforms[10].name,"array[0].struct_dvec3",&local_556);
        uniforms[10].expected_type = 0x8ffd;
        uniforms[10].location = p_Var4->uniform_structure_arrays[0].uniform_location_dvec3;
        uniforms[0xb].expected_array_size = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&uniforms[0xb].name,"array[0].struct_dvec4",&local_557);
        uniforms[0xb].expected_type = 0x8ffe;
        uniforms[0xb].location = p_Var4->uniform_structure_arrays[0].uniform_location_dvec4;
        uniforms[0xc].expected_array_size = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&uniforms[0xc].name,"array[1].struct_double",&local_558);
        uniforms[0xc].expected_type = 0x140a;
        uniforms[0xc].location = p_Var4->uniform_structure_arrays[0].uniform_location_double;
        uniforms[0xd].expected_array_size = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&uniforms[0xd].name,"array[1].struct_dvec2",&local_559);
        uniforms[0xd].expected_type = 0x8ffc;
        uniforms[0xd].location = p_Var4->uniform_structure_arrays[0].uniform_location_dvec2;
        uniforms[0xe].expected_array_size = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&uniforms[0xe].name,"array[1].struct_dvec3",&local_55a);
        uniforms[0xe].expected_type = 0x8ffd;
        uniforms[0xe].location = p_Var4->uniform_structure_arrays[0].uniform_location_dvec3;
        uniforms[0xf].expected_array_size = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&uniforms[0xf].name,"array[1].struct_dvec4",&local_55b);
        uniforms[0xf].expected_type = 0x8ffe;
        uniforms[0xf].location = p_Var4->uniform_structure_arrays[0].uniform_location_dvec4;
        for (lVar15 = 8; lVar15 != 0x308; lVar15 = lVar15 + 0x30) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)properties,pcVar11,(allocator<char> *)temp_buffer);
          __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)&uniforms[0].expected_array_size + lVar15);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         properties,__rhs);
          std::__cxx11::string::operator=((string *)__rhs,(string *)local_1d8);
          std::__cxx11::string::~string((string *)local_1d8);
          std::__cxx11::string::~string((string *)properties);
        }
        properties[0] = 0x92fb;
        properties[1] = 0x92fa;
        value_00 = uniforms;
        lVar15 = 0x10;
        while( true ) {
          bVar18 = lVar15 == 0;
          lVar15 = lVar15 + -1;
          if (bVar18) break;
          n_written_items = 0;
          retrieved_name_length = 0;
          temp_buffer[0] = 0;
          temp_buffer[1] = 0;
          uVar10 = (**(code **)(local_570 + 0x9a8))
                             (local_568,0x92e1,(value_00->name)._M_dataplus._M_p);
          dVar9 = (**(code **)(local_570 + 0x800))();
          glu::checkError(dVar9,"glGetProgramResourceIndex() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                          ,0x1ad2);
          memset(*value,0,(long)max_uniform_name_length);
          (**(code **)(local_570 + 0x9c0))
                    (local_568,0x92e1,uVar10,max_uniform_name_length,&retrieved_name_length,*value);
          dVar9 = (**(code **)(local_570 + 0x800))();
          glu::checkError(dVar9,"glGetProgramResourceName() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                          ,0x1ada);
          psVar1 = &value_00->name;
          if (((value_00->name)._M_string_length == (ulong)(uint)retrieved_name_length) &&
             (iVar8 = bcmp(*value,(psVar1->_M_dataplus)._M_p,(long)retrieved_name_length),
             iVar8 == 0)) {
            (**(code **)(local_570 + 0x9c8))
                      (local_568,0x92e1,uVar10,2,properties,2,&n_written_items);
            dVar9 = (**(code **)(local_570 + 0x800))();
            glu::checkError(dVar9,"glGetProgramResourceiv() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                            ,0x1aee);
            if (n_written_items != 2) {
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,
                         "Invalid amount of items were reported by glGetProgramResourceiv() call.",
                         (char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                         ,0x1af2);
              __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
            }
            GVar5 = temp_buffer[0];
            GVar6 = temp_buffer[1];
            if (temp_buffer[0] != value_00->expected_array_size) {
              local_1d8 = (undefined1  [8])
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1d0);
              std::operator<<(&local_1d0,"Invalid array size reported for uniform [");
              std::operator<<(&local_1d0,(string *)psVar1);
              std::operator<<(&local_1d0,"]");
              std::operator<<(&local_1d0,": expected:[");
              pMVar12 = tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)local_1d8,&value_00->expected_array_size);
              poVar2 = &pMVar12->m_str;
              std::operator<<(&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,
                              "], reported:[");
              std::ostream::operator<<(poVar2,GVar5);
              std::operator<<(&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,"]");
              tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0);
              bVar7 = false;
            }
            if (GVar6 != value_00->expected_type) {
              local_1d8 = (undefined1  [8])
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1d0);
              std::operator<<(&local_1d0,"Invalid type reported for uniform [");
              std::operator<<(&local_1d0,(string *)psVar1);
              std::operator<<(&local_1d0,"]");
              std::operator<<(&local_1d0,": expected:[");
              pMVar12 = tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)local_1d8,&value_00->expected_type);
              poVar2 = &pMVar12->m_str;
              std::operator<<(&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,
                              "], reported:[");
              std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
              std::operator<<(&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,"]");
              tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0);
              bVar7 = false;
            }
          }
          else {
            local_1d8 = (undefined1  [8])
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1d0);
            std::operator<<(&local_1d0,"Invalid uniform name was reported at index [");
            std::ostream::_M_insert<unsigned_long>((ulong)&local_1d0);
            std::operator<<(&local_1d0,"]: expected:[");
            std::operator<<(&local_1d0,(string *)psVar1);
            std::operator<<(&local_1d0,"], reported:[");
            pMVar12 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1d8,value);
            std::operator<<(&(pMVar12->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"]"
                           );
            tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0);
            bVar7 = false;
          }
          value_00 = value_00 + 1;
        }
        lVar15 = 0x2d8;
        do {
          std::__cxx11::string::~string((string *)((long)&uniforms[0].expected_array_size + lVar15))
          ;
          lVar15 = lVar15 + -0x30;
        } while (lVar15 != -0x28);
      }
      if (*value != (char *)0x0) {
        operator_delete__(*value);
        *value = (char *)0x0;
      }
    }
    lVar14 = lVar14 + 1;
  } while( true );
}

Assistant:

bool GPUShaderFP64Test4::verifyProgramInterfaceQuerySupport()
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* Iterate through all programs */
	const char*		   cs_prefixes[]	= { "cs_" };
	_stage_data*	   cs_stages[]		= { &m_data_cs };
	const char*		   noncs_prefixes[] = { "fs_", "gs_", "tc_", "te_", "vs_" };
	_stage_data*	   noncs_stages[]   = { &m_data_fs, &m_data_gs, &m_data_tc, &m_data_te, &m_data_vs };
	const unsigned int n_cs_stages		= sizeof(cs_stages) / sizeof(cs_stages[0]);
	const unsigned int n_noncs_stages   = sizeof(noncs_stages) / sizeof(noncs_stages[0]);

	const glw::GLuint  programs[] = { m_po_cs_id, m_po_noncs_id };
	const unsigned int n_programs = sizeof(programs) / sizeof(programs[0]);

	for (unsigned int n_program = 0; n_program < n_programs; ++n_program)
	{
		glw::GLuint   po_id			 = programs[n_program];
		unsigned int  n_stages		 = 0;
		const char**  stage_prefixes = DE_NULL;
		_stage_data** stage_data	 = DE_NULL;

		if (po_id == m_po_cs_id)
		{
			n_stages	   = n_cs_stages;
			stage_data	 = cs_stages;
			stage_prefixes = cs_prefixes;
		}
		else
		{
			n_stages	   = n_noncs_stages;
			stage_data	 = noncs_stages;
			stage_prefixes = noncs_prefixes;
		}

		/* Skip compute shader program if not supported */
		if (0 == po_id)
		{
			continue;
		}

		/* Determine maximum uniform name length */
		glw::GLint max_uniform_name_length = 0;

		gl.getProgramInterfaceiv(po_id, GL_UNIFORM, GL_MAX_NAME_LENGTH, &max_uniform_name_length);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInterfaceiv() call failed.");

		/* Allocate a buffer we will use to hold uniform names */
		m_uniform_name_buffer = new char[max_uniform_name_length];

		for (unsigned int n_stage = 0; n_stage < n_stages; ++n_stage)
		{
			/* Iterate through all uniforms */
			_stage_data* stage_ptr	= stage_data[n_stage];
			const char*  stage_prefix = stage_prefixes[n_stage];

			/* Construct an array that will be used to run the test in an automated manner */
			_program_interface_query_test_item uniforms[] = {
				/* array size */ /* name */ /* type */ /* location */
				{ 1, "double", GL_DOUBLE, stage_ptr->uniforms.uniform_location_double },
				{ 2, "double_arr[0]", GL_DOUBLE, stage_ptr->uniforms.uniform_location_double_arr[0] },
				{ 1, "dvec2", GL_DOUBLE_VEC2, stage_ptr->uniforms.uniform_location_dvec2 },
				{ 2, "dvec2_arr[0]", GL_DOUBLE_VEC2, stage_ptr->uniforms.uniform_location_dvec2_arr[0] },
				{ 1, "dvec3", GL_DOUBLE_VEC3, stage_ptr->uniforms.uniform_location_dvec3 },
				{ 2, "dvec3_arr[0]", GL_DOUBLE_VEC3, stage_ptr->uniforms.uniform_location_dvec3_arr[0] },
				{ 1, "dvec4", GL_DOUBLE_VEC4, stage_ptr->uniforms.uniform_location_dvec4 },
				{ 2, "dvec4_arr[0]", GL_DOUBLE_VEC4, stage_ptr->uniforms.uniform_location_dvec4_arr[0] },
				{ 1, "array[0].struct_double", GL_DOUBLE,
				  stage_ptr->uniform_structure_arrays->uniform_location_double },
				{ 1, "array[0].struct_dvec2", GL_DOUBLE_VEC2,
				  stage_ptr->uniform_structure_arrays->uniform_location_dvec2 },
				{ 1, "array[0].struct_dvec3", GL_DOUBLE_VEC3,
				  stage_ptr->uniform_structure_arrays->uniform_location_dvec3 },
				{ 1, "array[0].struct_dvec4", GL_DOUBLE_VEC4,
				  stage_ptr->uniform_structure_arrays->uniform_location_dvec4 },
				{ 1, "array[1].struct_double", GL_DOUBLE,
				  stage_ptr->uniform_structure_arrays->uniform_location_double },
				{ 1, "array[1].struct_dvec2", GL_DOUBLE_VEC2,
				  stage_ptr->uniform_structure_arrays->uniform_location_dvec2 },
				{ 1, "array[1].struct_dvec3", GL_DOUBLE_VEC3,
				  stage_ptr->uniform_structure_arrays->uniform_location_dvec3 },
				{ 1, "array[1].struct_dvec4", GL_DOUBLE_VEC4,
				  stage_ptr->uniform_structure_arrays->uniform_location_dvec4 },
			};
			const unsigned int n_uniforms = sizeof(uniforms) / sizeof(uniforms[0]);

			/* Prefix the names with stage-specific string */
			for (unsigned int n_uniform = 0; n_uniform < n_uniforms; ++n_uniform)
			{
				_program_interface_query_test_item& current_item = uniforms[n_uniform];

				current_item.name = std::string(stage_prefix) + current_item.name;
			} /* for (all uniform descriptors) */

			const glw::GLenum  properties[] = { GL_ARRAY_SIZE, GL_TYPE };
			const unsigned int n_properties = sizeof(properties) / sizeof(properties[0]);

			for (unsigned int n_uniform = 0; n_uniform < n_uniforms; ++n_uniform)
			{
				_program_interface_query_test_item& current_item		  = uniforms[n_uniform];
				glw::GLint							n_written_items		  = 0;
				glw::GLint							retrieved_array_size  = 0;
				glw::GLint							retrieved_name_length = 0;
				glw::GLenum							retrieved_type		  = GL_NONE;
				glw::GLint							temp_buffer[2]		  = { 0, GL_NONE };

				/* Retrieve index of the iteration-specific uniform */
				glw::GLuint resource_index = gl.getProgramResourceIndex(po_id, GL_UNIFORM, current_item.name.c_str());
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramResourceIndex() call failed.");

				/* Make sure glGetProgramResourceName() returns correct values */
				memset(m_uniform_name_buffer, 0, max_uniform_name_length);

				gl.getProgramResourceName(po_id, GL_UNIFORM, /* interface */
										  resource_index, max_uniform_name_length, &retrieved_name_length,
										  m_uniform_name_buffer);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramResourceName() call failed.");

				if (current_item.name.length() != (glw::GLuint)retrieved_name_length ||
					memcmp(m_uniform_name_buffer, current_item.name.c_str(), retrieved_name_length) != 0)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid uniform name was reported at index ["
									   << resource_index << "]"
															": expected:["
									   << current_item.name << "]"
															   ", reported:["
									   << m_uniform_name_buffer << "]" << tcu::TestLog::EndMessage;

					result = false;
					continue;
				}

				/* Make sure glGetProgramResourceiv() returns correct values for GL_TYPE and GL_ARRAY_SIZE queries */
				gl.getProgramResourceiv(po_id, GL_UNIFORM, /* interface */
										resource_index, n_properties, properties,
										sizeof(temp_buffer) / sizeof(temp_buffer[0]), &n_written_items, temp_buffer);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramResourceiv() call failed.");

				if (n_written_items != n_properties)
				{
					TCU_FAIL("Invalid amount of items were reported by glGetProgramResourceiv() call.");
				}

				/* For clarity, copy the retrieved values to separate variables */
				retrieved_array_size = temp_buffer[0];
				retrieved_type		 = temp_buffer[1];

				/* Verify the values */
				if (retrieved_array_size != current_item.expected_array_size)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid array size reported for uniform ["
									   << current_item.name << "]"
									   << ": expected:[" << current_item.expected_array_size << "]"
																								", reported:["
									   << retrieved_array_size << "]" << tcu::TestLog::EndMessage;

					result = false;
				}

				if (retrieved_type != current_item.expected_type)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid type reported for uniform ["
									   << current_item.name << "]"
									   << ": expected:[" << current_item.expected_type << "]"
																						  ", reported:["
									   << retrieved_type << "]" << tcu::TestLog::EndMessage;

					result = false;
				}
			} /* for (all uniforms) */
		}	 /* for (all shader stages) */

		/* We're now OK to release the buffer we used to hold uniform names for
		 * the program */
		if (m_uniform_name_buffer != DE_NULL)
		{
			delete[] m_uniform_name_buffer;

			m_uniform_name_buffer = DE_NULL;
		}
	} /* for (both program objects) */

	return result;
}